

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::ConditionBinsSelectExpr>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          ConditionBinsSelectExpr *t)

{
  if ((t->super_BinsSelectExpr).kind != Invalid) {
    ConditionBinsSelectExpr::visitExprs<slang::ast::CheckerMemberVisitor&>
              (t,(CheckerMemberVisitor *)this);
    return;
  }
  return;
}

Assistant:

bool bad() const { return kind == BinsSelectExprKind::Invalid; }